

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcSymObjBase::add_template(CTcSymObjBase *this,CTcObjTemplate *tpl)

{
  CTcObjTemplate *pCVar1;
  
  pCVar1 = this->template_tail_ + 0x10;
  if (this->template_tail_ == (CTcObjTemplate *)0x0) {
    pCVar1 = (CTcObjTemplate *)&this->template_head_;
  }
  *(CTcObjTemplate **)pCVar1 = tpl;
  this->template_tail_ = tpl;
  return;
}

Assistant:

void CTcSymObjBase::add_template(CTcObjTemplate *tpl)
{
    /* link it in at the tail of our list */
    if (template_tail_ != 0)
        template_tail_->nxt_ = tpl;
    else
        template_head_ = tpl;
    template_tail_ = tpl;
}